

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.h
# Opt level: O3

uint re2c::Skeleton::rule2key<unsigned_int>(rule_rank_t r)

{
  bool bVar1;
  uint32_t uVar2;
  rule_rank_t local_4;
  
  bVar1 = rule_rank_t::is_none(&local_4);
  uVar2 = 0xffffffff;
  if (!bVar1) {
    bVar1 = rule_rank_t::is_def(&local_4);
    uVar2 = 0xfffffffe;
    if (!bVar1) {
      uVar2 = rule_rank_t::uint32(&local_4);
    }
  }
  return uVar2;
}

Assistant:

key_t Skeleton::rule2key (rule_rank_t r)
{
	if (r.is_none()) {
		return std::numeric_limits<key_t>::max();
	} else if (r.is_def()) {
		key_t k = std::numeric_limits<key_t>::max();
		return --k;
	} else {
		return static_cast<key_t>(r.uint32());
	}
}